

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<double>::TPZVec(TPZVec<double> *this,initializer_list<double> *list)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  void *pvVar4;
  const_iterator pdVar5;
  initializer_list<double> *in_RSI;
  undefined8 *in_RDI;
  double *aux;
  const_iterator it_end;
  const_iterator it;
  size_type size;
  initializer_list<double> *in_stack_ffffffffffffffd0;
  double *pdVar6;
  const_iterator local_20;
  
  *in_RDI = &PTR__TPZVec_023d3108;
  in_RDI[1] = 0;
  sVar2 = std::initializer_list<double>::size(in_RSI);
  if (sVar2 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    in_RDI[1] = pvVar4;
  }
  local_20 = std::initializer_list<double>::begin(in_RSI);
  pdVar5 = std::initializer_list<double>::end(in_stack_ffffffffffffffd0);
  pdVar6 = (double *)in_RDI[1];
  for (; local_20 != pdVar5; local_20 = local_20 + 1) {
    *pdVar6 = *local_20;
    pdVar6 = pdVar6 + 1;
  }
  in_RDI[2] = sVar2;
  in_RDI[3] = sVar2;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}